

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

int4 __thiscall ActionDynamicSymbols::apply(ActionDynamicSymbols *this,Funcdata *data)

{
  int4 *piVar1;
  ScopeLocal *pSVar2;
  long *plVar3;
  Symbol *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Varnode *this_01;
  ostream *poVar7;
  PcodeOp *pPVar8;
  Varnode **ppVVar9;
  Varnode *pVVar10;
  HighVariable *pHVar11;
  long *plVar12;
  int4 iVar13;
  DynamicHash dhash;
  ostringstream s;
  string local_260;
  ActionDynamicSymbols *local_240;
  long *local_238;
  DynamicHash local_230;
  SymbolEntry local_1a8;
  ios_base local_138 [264];
  
  pSVar2 = data->localmap;
  local_240 = this;
  iVar5 = (*(pSVar2->super_ScopeInternal).super_Scope._vptr_Scope[0xc])(pSVar2);
  iVar6 = (*(pSVar2->super_ScopeInternal).super_Scope._vptr_Scope[0xd])(pSVar2);
  local_238 = (long *)CONCAT44(extraout_var_00,iVar6);
  local_230.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.addrresult.base = (AddrSpace *)0x0;
  if ((long *)CONCAT44(extraout_var,iVar5) != local_238) {
    plVar12 = (long *)CONCAT44(extraout_var,iVar5);
    do {
      plVar3 = (long *)*plVar12;
      this_00 = (Symbol *)plVar12[2];
      DynamicHash::clear(&local_230);
      SymbolEntry::getFirstUseAddress(&local_1a8);
      this_01 = DynamicHash::findVarnode(&local_230,data,(Address *)&local_1a8,plVar12[6]);
      if ((this_01 != (Varnode *)0x0) && (this_01->mapentry != (SymbolEntry *)(plVar12 + 2))) {
        if (this_01->size == *(int *)((long)plVar12 + 0x3c)) {
          if ((this_01->flags & 0x40) != 0) {
            if (((this_01->flags & 0x10) == 0) || (this_01->def->opcode->opcode != CPUI_CAST)) {
              pPVar8 = Varnode::loneDescend(this_01);
              if ((pPVar8 != (PcodeOp *)0x0) && (pPVar8->opcode->opcode == CPUI_CAST)) {
                ppVVar9 = &pPVar8->output;
                goto LAB_002e8a8f;
              }
              pVVar10 = (Varnode *)0x0;
            }
            else {
              ppVVar9 = (this_01->def->inrefs).
                        super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
LAB_002e8a8f:
              pVVar10 = *ppVVar9;
            }
            if ((pVVar10 != (Varnode *)0x0) && ((pVVar10->flags & 0x80) != 0)) {
              this_01 = pVVar10;
            }
          }
          if ((*(byte *)((long)plVar12 + 0x1b) & 0xc) == 0) {
            iVar13 = -1;
          }
          else {
            iVar13 = (int4)plVar12[7];
          }
          pHVar11 = Varnode::getHigh(this_01);
          pHVar11->symbol = this_00;
          pHVar11->symboloffset = iVar13;
          if ((this_00->flags & 0x100) == 0) {
            (*(pSVar2->super_ScopeInternal).super_Scope._vptr_Scope[0x15])
                      (pSVar2,this_00,this_01->type);
          }
          else if (this_00->type != this_01->type) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Unable to use type for symbol ",0x1e);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(this_00->name)._M_dataplus._M_p,
                       (this_00->name)._M_string_length);
            std::__cxx11::stringbuf::str();
            Funcdata::warningHeader(data,&local_260);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_260._M_dataplus._M_p._1_7_,local_260._M_dataplus._M_p._0_1_) !=
                &local_260.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_260._M_dataplus._M_p._1_7_,
                                       local_260._M_dataplus._M_p._0_1_));
            }
            (*(pSVar2->super_ScopeInternal).super_Scope._vptr_Scope[0x15])
                      (pSVar2,this_00,this_01->type);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          piVar1 = &(local_240->super_Action).count;
          *piVar1 = *piVar1 + 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Unable to use symbol ",0x15);
          bVar4 = Symbol::isNameUndefined(this_00);
          if (!bVar4) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1a8,(this_00->name)._M_dataplus._M_p,
                                (this_00->name)._M_string_length);
            local_260._M_dataplus._M_p._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_260,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,": Size does not match variable it labels",0x28);
          std::__cxx11::stringbuf::str();
          Funcdata::warningHeader(data,&local_260);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_260._M_dataplus._M_p._1_7_,local_260._M_dataplus._M_p._0_1_) !=
              &local_260.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_260._M_dataplus._M_p._1_7_,
                                     local_260._M_dataplus._M_p._0_1_));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      plVar12 = plVar3;
    } while (plVar3 != local_238);
  }
  if (local_230.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_230.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.vnedge.
                    super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_230.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.markvn.
                    super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_230.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.markop.
                    super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int4 ActionDynamicSymbols::apply(Funcdata &data)

{
  ScopeLocal *localmap = data.getScopeLocal();
  list<SymbolEntry>::const_iterator iter,enditer;
  iter = localmap->beginDynamic();
  enditer = localmap->endDynamic();
  DynamicHash dhash;
  while(iter != enditer) {
    const SymbolEntry &entry( *iter );
    ++iter;
    Symbol *sym = entry.getSymbol();
    dhash.clear();
    Varnode *vn = dhash.findVarnode(&data,entry.getFirstUseAddress(),entry.getHash());
    if (vn == (Varnode *)0) {
      //      localmap->removeSymbol(sym); // If it didn't map to anything, remove it
      continue;
    }
    if (vn->getSymbolEntry() == &entry) continue; // Already applied it
    if (vn->getSize() != entry.getSize()) {
      ostringstream s;
      s << "Unable to use symbol ";
      if (!sym->isNameUndefined())
	s << sym->getName() << ' ';
      s << ": Size does not match variable it labels";
      data.warningHeader(s.str());
      //      localmap->removeSymbol(sym); // Don't use the symbol
      continue;
    }
    if (vn->getSymbolEntry() == &entry) continue; // Already applied it

    if (vn->isImplied()) {	// This should be finding an explicit, but a cast may have been inserted
      Varnode *newvn = (Varnode *)0;
      // Look at the "other side" of the cast
      if (vn->isWritten() && (vn->getDef()->code() == CPUI_CAST))
	newvn = vn->getDef()->getIn(0);
      else {
	PcodeOp *castop = vn->loneDescend();
	if ((castop != (PcodeOp *)0)&&(castop->code() == CPUI_CAST))
	  newvn = castop->getOut();
      }
      // See if the varnode on the other side is explicit
      if ((newvn != (Varnode *)0)&&(newvn->isExplicit()))
	vn = newvn;		// in which case we use it
    }

    int4 offset;
    if (!entry.isPiece())
      offset = -1;
    else
      offset = entry.getOffset();
    vn->getHigh()->setSymbol(sym,offset);
    if (!sym->isTypeLocked()) {	// If the dynamic symbol did not lock its type
      localmap->retypeSymbol(sym,vn->getType()); // use the type propagated into the varnode
    }
    else if (sym->getType() != vn->getType()) {
      ostringstream s;
      s << "Unable to use type for symbol " << sym->getName();
      data.warningHeader(s.str());
      localmap->retypeSymbol(sym,vn->getType()); // use the type propagated into the varnode
    }
    // FIXME: Setting the symbol here (for the first time) gives the type no time to propagate properly
    // Currently the casts aren't set properly

    count += 1;
  }
  return 0;
}